

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O0

bool glcts::PipelineStatisticsQueryTestFunctional2::executeClearTexSubImageTest(void *pThis)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined1 local_35;
  deUint32 local_34;
  ApiType AStack_30;
  uchar test_value;
  byte local_29;
  long lStack_28;
  bool result;
  Functions *gl;
  PipelineStatisticsQueryTestFunctional2 *data_ptr;
  void *pThis_local;
  
  gl = (Functions *)pThis;
  data_ptr = (PipelineStatisticsQueryTestFunctional2 *)pThis;
  pRVar3 = deqp::Context::getRenderContext(*(Context **)((long)pThis + 0x70));
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar2);
  local_29 = 1;
  pRVar3 = deqp::Context::getRenderContext((Context *)gl->bindFragDataLocationIndexed);
  AStack_30.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_34 = (deUint32)glu::ApiType::core(4,4);
  bVar1 = glu::contextSupports((ContextType)AStack_30.m_bits,(ApiType)local_34);
  if ((bVar1) || (*(long *)(lStack_28 + 0x218) != 0)) {
    local_35 = 0xff;
    (**(code **)(lStack_28 + 0x218))
              (*(undefined4 *)((long)&gl->bindVertexArray + 4),0,0,0,0,
               *(uint *)&gl->bindVertexBuffers >> 1,*(uint *)((long)&gl->bindVertexBuffer + 4) >> 1,
               1,0x1903,0x1401,&local_35);
    err = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(err,"glClearTexSubImage() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                    ,0xab0);
    pThis_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    pThis_local._7_1_ = false;
  }
  return pThis_local._7_1_;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeClearTexSubImageTest(void* pThis)
{
	PipelineStatisticsQueryTestFunctional2* data_ptr = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl		 = data_ptr->m_context.getRenderContext().getFunctions();
	bool									result   = true;

	if (!glu::contextSupports(data_ptr->m_context.getRenderContext().getType(), glu::ApiType::core(4, 4)) &&
		gl.clearTexSubImage == NULL)
	{
		/* API is unavailable */
		return false;
	}

	/* Execute the API call */
	const unsigned char test_value = 0xFF;

	gl.clearTexSubImage(data_ptr->m_to_draw_fbo_id, 0,							/* level */
						0,														/* xoffset */
						0,														/* yoffset */
						0,														/* zoffset */
						data_ptr->m_to_width / 2, data_ptr->m_to_height / 2, 1, /* depth */
						GL_RED, GL_UNSIGNED_BYTE, &test_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearTexSubImage() call failed.");

	/* All done */
	return result;
}